

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.h
# Opt level: O0

DiagnosticStream * __thiscall
spvtools::DiagnosticStream::operator<<(DiagnosticStream *this,char **val)

{
  char **val_local;
  DiagnosticStream *this_local;
  
  std::operator<<((ostream *)this,*val);
  return this;
}

Assistant:

DiagnosticStream& operator<<(const T& val) {
    stream_ << val;
    return *this;
  }